

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O1

QCborValueRef
QCborContainerPrivate::findOrAddMapKey<QStringView>(QCborValueRef self,QStringView key)

{
  pointer array;
  QCborContainerPrivate *this;
  pointer pEVar1;
  QCborContainerPrivate *pQVar2;
  QCborValueConstRef QVar3;
  
  pEVar1 = QList<QtCbor::Element>::data(&(self.super_QCborValueConstRef.d)->elements);
  array = pEVar1 + self.super_QCborValueConstRef.i;
  if (pEVar1[self.super_QCborValueConstRef.i].type != Map) {
    if (pEVar1[self.super_QCborValueConstRef.i].type == Array) {
      convertArrayToMap((QCborContainerPrivate **)array);
    }
    else {
      if (((array->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
           super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 1) != 0) {
        deref((array->field_0).container);
      }
      (array->field_0).value = 0;
    }
  }
  array->type = Map;
  array->flags = (QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>)0x1;
  QVar3 = (QCborValueConstRef)findOrAddMapKey<QStringView>((array->field_0).container,key);
  pQVar2 = QVar3.d;
  this = (array->field_0).container;
  if (this != pQVar2) {
    if (this != (QCborContainerPrivate *)0x0) {
      deref(this);
    }
    if (pQVar2 != (QCborContainerPrivate *)0x0) {
      LOCK();
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (array->field_0).container = pQVar2;
  }
  return (QCborValueRef)QVar3;
}

Assistant:

QCborValueRef
QCborContainerPrivate::findOrAddMapKey(QCborValueRef self, KeyType key)
{
    auto &e = self.d->elements[self.i];

    // we need a map, so convert if necessary
    if (e.type == QCborValue::Array) {
        convertArrayToMap(e.container);
    } else if (e.type != QCborValue::Map) {
        if (e.flags & QtCbor::Element::IsContainer)
            e.container->deref();
        e.container = nullptr;
    }
    e.flags = QtCbor::Element::IsContainer;
    e.type = QCborValue::Map;

    QCborValueRef result = findOrAddMapKey<KeyType>(e.container, key);
    assignContainer(e.container, result.d);
    return result;
}